

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O3

void __thiscall
SimpleLogger::findMinMaxRevNum(SimpleLogger *this,size_t *min_revnum_out,size_t *max_revnum_out)

{
  pointer pcVar1;
  long lVar2;
  DIR *__dirp;
  dirent *pdVar3;
  size_t sVar4;
  SimpleLogger *this_00;
  bool min_revnum_initialized;
  size_t max_revnum;
  size_t min_revnum;
  string f_name;
  string file_name_only;
  string dir_path;
  bool local_b1;
  size_t local_b0;
  size_t local_a8;
  undefined1 local_a0 [32];
  undefined1 *local_80;
  undefined1 local_70 [16];
  size_t *local_60;
  size_t *local_58;
  char *local_50 [2];
  char local_40 [16];
  
  local_50[0] = local_40;
  local_58 = min_revnum_out;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"./","");
  local_80 = local_70;
  pcVar1 = (this->filePath)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + (this->filePath)._M_string_length);
  lVar2 = std::__cxx11::string::rfind((char *)this,0x46a6cf,0xffffffffffffffff);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)local_a0,(ulong)this);
    std::__cxx11::string::operator=((string *)local_50,(string *)local_a0);
    if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
      operator_delete((void *)local_a0._0_8_);
    }
    std::__cxx11::string::substr((ulong)local_a0,(ulong)this);
    std::__cxx11::string::operator=((string *)&local_80,(string *)local_a0);
    if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
      operator_delete((void *)local_a0._0_8_);
    }
  }
  local_b1 = false;
  local_a8 = 0;
  local_b0 = 0;
  __dirp = opendir(local_50[0]);
  if (__dirp != (DIR *)0x0) {
    local_60 = max_revnum_out;
    while( true ) {
      pdVar3 = readdir(__dirp);
      if (pdVar3 == (dirent *)0x0) break;
      local_a0._0_8_ = local_a0 + 0x10;
      sVar4 = strlen(pdVar3->d_name);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,pdVar3->d_name,pdVar3->d_name + sVar4);
      this_00 = (SimpleLogger *)local_a0;
      lVar2 = std::__cxx11::string::rfind((char *)local_a0,(ulong)local_80,0xffffffffffffffff);
      if (lVar2 != -1) {
        findMinMaxRevNumInternal(this_00,&local_b1,&local_a8,&local_b0,(string *)local_a0);
      }
      if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
        operator_delete((void *)local_a0._0_8_);
      }
    }
    closedir(__dirp);
    max_revnum_out = local_60;
  }
  *local_58 = local_a8;
  *max_revnum_out = local_b0;
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return;
}

Assistant:

void SimpleLogger::findMinMaxRevNum( size_t& min_revnum_out,
                                     size_t& max_revnum_out )
{
    std::string dir_path = "./";
    std::string file_name_only = filePath;
    size_t last_pos = filePath.rfind("/");
    if (last_pos != std::string::npos) {
        dir_path = filePath.substr(0, last_pos);
        file_name_only = filePath.substr
                         ( last_pos + 1, filePath.size() - last_pos - 1 );
    }

    bool min_revnum_initialized = false;
    size_t min_revnum = 0;
    size_t max_revnum = 0;

#if defined(__linux__) || defined(__APPLE__)
    DIR* dir_info = opendir(dir_path.c_str());
    struct dirent *dir_entry = nullptr;
    while ( dir_info && (dir_entry = readdir(dir_info)) ) {
        std::string f_name(dir_entry->d_name);
        size_t f_name_pos = f_name.rfind(file_name_only);
        // Irrelavent file: skip.
        if (f_name_pos == std::string::npos) continue;

        findMinMaxRevNumInternal(min_revnum_initialized,
                                 min_revnum,
                                 max_revnum,
                                 f_name);
    }
    if (dir_info) {
        closedir(dir_info);
    }
#elif defined(WIN32) || defined(_WIN32)
    // Windows
    WIN32_FIND_DATA filedata;
    HANDLE hfind;
    std::string query_str = dir_path + "*";

    // find all files start with 'prefix'
    hfind = FindFirstFile(query_str.c_str(), &filedata);
    while (hfind != INVALID_HANDLE_VALUE) {
        std::string f_name(filedata.cFileName);
        size_t f_name_pos = f_name.rfind(file_name_only);
        // Irrelavent file: skip.
        if (f_name_pos != std::string::npos) {
            findMinMaxRevNumInternal(min_revnum_initialized,
                                     min_revnum,
                                     max_revnum,
                                     f_name);
        }

        if (!FindNextFile(hfind, &filedata)) {
            FindClose(hfind);
            hfind = INVALID_HANDLE_VALUE;
        }
    }
#endif

    min_revnum_out = min_revnum;
    max_revnum_out = max_revnum;
}